

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_decomposer.hpp
# Opt level: O0

void __thiscall
Catch::
BinaryExpr<int,_const_isocpp_p1950::indirect_value<int,_isocpp_p1950::default_copy<int>,_std::default_delete<int>_>_&>
::streamReconstructedExpression
          (BinaryExpr<int,_const_isocpp_p1950::indirect_value<int,_isocpp_p1950::default_copy<int>,_std::default_delete<int>_>_&>
           *this,ostream *os)

{
  indirect_value<int,_isocpp_p1950::default_copy<int>,_std::default_delete<int>_> *e;
  string *in_R9;
  StringRef op;
  string local_68;
  string *local_48;
  char *pcStack_40;
  string local_38;
  ostream *local_18;
  ostream *os_local;
  BinaryExpr<int,_const_isocpp_p1950::indirect_value<int,_isocpp_p1950::default_copy<int>,_std::default_delete<int>_>_&>
  *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  Detail::stringify<int>(&local_38,(int *)&(this->super_ITransientExpression).field_0xc);
  local_48 = (string *)(this->m_op).m_start;
  pcStack_40 = (char *)(this->m_op).m_size;
  Detail::
  stringify<isocpp_p1950::indirect_value<int,isocpp_p1950::default_copy<int>,std::default_delete<int>>>
            (&local_68,(Detail *)this->m_rhs,e);
  op.m_size = (size_type)&local_68;
  op.m_start = pcStack_40;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_38,local_48,op,in_R9);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }